

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O2

IVec4 __thiscall tcu::getFormatMinIntValue(tcu *this,TextureFormat *format)

{
  uint uVar1;
  undefined8 extraout_RDX;
  int s;
  IVec4 IVar2;
  
  uVar1 = format->type - SIGNED_INT8;
  s = 0;
  if (uVar1 < 3) {
    s = *(int *)(&DAT_00608888 + (ulong)uVar1 * 4);
  }
  Vector<int,_4>::Vector((Vector<int,_4> *)this,s);
  IVar2.m_data[2] = (int)extraout_RDX;
  IVar2.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar2.m_data._0_8_ = this;
  return (IVec4)IVar2.m_data;
}

Assistant:

IVec4 getFormatMinIntValue (const TextureFormat& format)
{
	DE_ASSERT(getTextureChannelClass(format.type) == TEXTURECHANNELCLASS_SIGNED_INTEGER);

	switch (format.type)
	{
		case TextureFormat::SIGNED_INT8:	return IVec4(std::numeric_limits<deInt8>::min());
		case TextureFormat::SIGNED_INT16:	return IVec4(std::numeric_limits<deInt16>::min());
		case TextureFormat::SIGNED_INT32:	return IVec4(std::numeric_limits<deInt32>::min());

		default:
			DE_FATAL("Invalid channel type");
			return IVec4(0);
	}
}